

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O2

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<__int128>::Visit
          (PrecomputeVisitor<__int128> *this,shared_ptr<const_calc4::BinaryOperator> *op)

{
  BinaryType BVar1;
  __shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __int128 *dest;
  shared_ptr<const_calc4::Operator> sVar4;
  __int128 result;
  __int128 rightValue;
  __int128 leftValue;
  shared_ptr<const_calc4::Operator> right;
  shared_ptr<const_calc4::Operator> left;
  __shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<const_calc4::Operator> local_68;
  shared_ptr<const_calc4::Operator> local_58;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  Precompute((PrecomputeVisitor<__int128> *)(local_40 + 0x10),
             (shared_ptr<const_calc4::Operator> *)this);
  sVar4 = Precompute((PrecomputeVisitor<__int128> *)local_40,
                     (shared_ptr<const_calc4::Operator> *)this);
  bVar3 = TryGetPrecomputedValue
                    ((PrecomputeVisitor<__int128> *)(local_40 + 0x10),&local_58,
                     (__int128 *)
                     sVar4.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._M_pi);
  if (bVar3) {
    bVar3 = TryGetPrecomputedValue((PrecomputeVisitor<__int128> *)local_40,&local_68,dest);
    if (bVar3) {
      BVar1 = ((op->super___shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->type;
      if (BVar1 == Div) {
        if (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0 ||
            local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_78 = (__shared_ptr<const_calc4::BinaryOperator,_(__gnu_cxx::_Lock_policy)2>)
                     __divti3(local_58.
                              super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,local_58.
                                     super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
          PrecomputedOperator::Create<__int128>((__int128 *)&local_20);
          std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
                     (__shared_ptr<const_calc4::PrecomputedOperator,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_20);
          p_Var2 = &local_20;
          goto LAB_0011bd95;
        }
      }
      else if (BVar1 != Mod ||
               (local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0 ||
               local_68.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        (*(code *)(&DAT_0012ff50 + *(int *)(&DAT_0012ff50 + (ulong)BVar1 * 4)))
                  (local_58.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_58.
                          super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
        return;
      }
    }
  }
  BinaryOperator::Create
            ((shared_ptr<const_calc4::Operator> *)&local_78,
             (shared_ptr<const_calc4::Operator> *)(local_40 + 0x10),(BinaryType)local_40);
  std::__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<calc4::Operator_const,(__gnu_cxx::_Lock_policy)2> *)&this->value,
             &local_78);
  p_Var2 = &local_78;
LAB_0011bd95:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const BinaryOperator>& op) override
    {
        std::shared_ptr<const Operator> left = Precompute(op->GetLeft());
        std::shared_ptr<const Operator> right = Precompute(op->GetRight());

        TNumber leftValue, rightValue;
        if (TryGetPrecomputedValue(left, &leftValue) &&
            TryGetPrecomputedValue(right, &rightValue) &&
            !((op->GetType() == BinaryType::Div || op->GetType() == BinaryType::Mod) &&
              rightValue == 0))
        {
            TNumber result;

            switch (op->GetType())
            {
            case BinaryType::Add:
                result = leftValue + rightValue;
                break;
            case BinaryType::Sub:
                result = leftValue - rightValue;
                break;
            case BinaryType::Mult:
                result = leftValue * rightValue;
                break;
            case BinaryType::Div:
                result = leftValue / rightValue;
                break;
            case BinaryType::Mod:
                result = leftValue % rightValue;
                break;
            case BinaryType::Equal:
                result = (leftValue == rightValue) ? 1 : 0;
                break;
            case BinaryType::NotEqual:
                result = (leftValue != rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThan:
                result = (leftValue < rightValue) ? 1 : 0;
                break;
            case BinaryType::LessThanOrEqual:
                result = (leftValue <= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThanOrEqual:
                result = (leftValue >= rightValue) ? 1 : 0;
                break;
            case BinaryType::GreaterThan:
                result = (leftValue > rightValue) ? 1 : 0;
                break;
            default:
                UNREACHABLE();
                break;
            }

            value = PrecomputedOperator::Create(result);
        }
        else
        {
            value = BinaryOperator::Create(left, right, op->GetType());
        }
    }